

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void concatwsFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uchar *puVar1;
  char *zSep;
  int nSep;
  
  sqlite3_value_bytes((sqlite3_value *)0x224953);
  puVar1 = sqlite3_value_text((sqlite3_value *)0x224964);
  if (puVar1 != (uchar *)0x0) {
    concatFuncCore(context,argc,argv,nSep,zSep);
  }
  return;
}

Assistant:

static void concatwsFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int nSep = sqlite3_value_bytes(argv[0]);
  const char *zSep = (const char*)sqlite3_value_text(argv[0]);
  if( zSep==0 ) return;
  concatFuncCore(context, argc-1, argv+1, nSep, zSep);
}